

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplifiable_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *sigma)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *this_00;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_68;
  boost_vertex_handle local_34;
  ulong local_30;
  size_t i;
  ulong local_20;
  size_t num_vertices_to_add;
  Simplex *sigma_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  num_vertices_to_add = (size_t)sigma;
  sigma_local = (Simplex *)this;
  iVar2 = (*this->_vptr_Skeleton_blocker_complex[9])(this,sigma);
  if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!this->contains(sigma)",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_simplifiable_complex.h"
                  ,0xc6,
                  "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex(const Simplex &) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
                 );
  }
  iVar2 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          ::dimension((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                       *)num_vertices_to_add);
  if (iVar2 < 2) {
    __assert_fail("sigma.dimension() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_simplifiable_complex.h"
                  ,199,
                  "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex(const Simplex &) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
                 );
  }
  bVar1 = contains_vertices(this,(Simplex *)num_vertices_to_add);
  if (!bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "add_simplex: Some vertices were not present in the complex, adding them"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    i._4_4_ = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              ::last_vertex((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                             *)num_vertices_to_add);
    iVar2 = Skeleton_blocker_simple_traits::Vertex_handle::operator_cast_to_int
                      ((Vertex_handle *)((long)&i + 4));
    iVar3 = num_vertices(this);
    local_20 = (ulong)((iVar2 - iVar3) + 1);
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      local_34 = (boost_vertex_handle)add_vertex(this);
    }
  }
  bVar1 = contains_vertices(this,(Simplex *)num_vertices_to_add);
  if (bVar1) {
    bVar1 = contains_edges(this,(Simplex *)num_vertices_to_add);
    if (!bVar1) {
      add_edge(this,(Simplex *)num_vertices_to_add);
    }
    remove_blocker_include_in_simplex(this,(Simplex *)num_vertices_to_add);
    Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::Skeleton_blocker_simplex
              (&local_68,
               (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                *)num_vertices_to_add);
    add_blockers_after_simplex_insertion(this,&local_68);
    Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::~Skeleton_blocker_simplex(&local_68);
    return;
  }
  __assert_fail("contains_vertices(sigma)",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_simplifiable_complex.h"
                ,0xce,
                "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex(const Simplex &) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
               );
}

Assistant:

void Skeleton_blocker_complex<SkeletonBlockerDS>::add_simplex(const Simplex& sigma) {
  // to add a simplex s, all blockers included in s are first removed
  // and then all simplex in the coboundary of s are added as blockers
  assert(!this->contains(sigma));
  assert(sigma.dimension() > 1);
  if (!contains_vertices(sigma)) {
    std::cerr << "add_simplex: Some vertices were not present in the complex, adding them" << std::endl;
    size_t num_vertices_to_add = sigma.last_vertex() - this->num_vertices() + 1;
    for (size_t i = 0; i < num_vertices_to_add; ++i)
      this->add_vertex();
  }
  assert(contains_vertices(sigma));
  if (!contains_edges(sigma))
    add_edge(sigma);
  remove_blocker_include_in_simplex(sigma);
  add_blockers_after_simplex_insertion(sigma);
}